

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O0

apx_error_t
state_determine_array_length_from_read_buffer(apx_vm_readState_t *self,apx_vm_readBuffer_t *buffer)

{
  uint8_t *puVar1;
  uint8_t *result;
  apx_vm_readBuffer_t *buffer_local;
  apx_vm_readState_t *self_local;
  
  if (self->dynamic_size_type == '\0') {
    self_local._4_4_ = 1;
  }
  else {
    puVar1 = apx_vm_parse_uint32_by_size_type
                       (buffer->next,buffer->end,self->dynamic_size_type,&self->array_len);
    if ((buffer->next < puVar1) && (puVar1 <= buffer->end)) {
      buffer->next = puVar1;
      self_local._4_4_ = 0;
    }
    else {
      self_local._4_4_ = 0x25;
    }
  }
  return self_local._4_4_;
}

Assistant:

static apx_error_t state_determine_array_length_from_read_buffer(apx_vm_readState_t* self, apx_vm_readBuffer_t* buffer)
{
   if (self->dynamic_size_type == APX_SIZE_TYPE_NONE)
   {
      return APX_INVALID_ARGUMENT_ERROR;
   }
   uint8_t const* result = apx_vm_parse_uint32_by_size_type(buffer->next, buffer->end, self->dynamic_size_type, &self->array_len);
   if ((result > buffer->next) && (result <= buffer->end))
   {
      buffer->next = result;
   }
   else
   {
      return APX_BUFFER_BOUNDARY_ERROR;
   }
   return APX_NO_ERROR;
}